

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

void __thiscall
duckdb::OperatorProfiler::OperatorProfiler(OperatorProfiler *this,ClientContext *context)

{
  profiler_settings_t *this_00;
  QueryProfiler *pQVar1;
  bool bVar2;
  __node_base *p_Var3;
  MetricsType metric_1;
  profiler_settings_t root_metrics;
  
  this->context = context;
  this_00 = &this->settings;
  (this->settings)._M_h._M_buckets = &(this->settings)._M_h._M_single_bucket;
  (this->settings)._M_h._M_bucket_count = 1;
  (this->settings)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->settings)._M_h._M_element_count = 0;
  (this->settings)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->active_operator).ptr = (PhysicalOperator *)0x0;
  (this->settings)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->settings)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->op).start.__d.__r = 0;
  (this->op).end.__d.__r = 0;
  (this->op).finished = false;
  (this->operator_infos)._M_h._M_buckets = &(this->operator_infos)._M_h._M_single_bucket;
  (this->operator_infos)._M_h._M_bucket_count = 1;
  (this->operator_infos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->operator_infos)._M_h._M_element_count = 0;
  (this->operator_infos)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->operator_infos)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->operator_infos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pQVar1 = QueryProfiler::Get(context);
  bVar2 = true;
  if (pQVar1->is_explain_analyze == false) {
    bVar2 = (pQVar1->context->config).enable_profiler;
  }
  this->enabled = bVar2;
  p_Var3 = &(context->config).profiler_settings._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    root_metrics._M_h._M_buckets._0_1_ = (MetricsType)*(size_type *)(p_Var3 + 1);
    ::std::__detail::
    _Insert_base<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)this_00,(value_type *)&root_metrics);
    ProfilingInfo::Expand(this_00,(MetricsType)root_metrics._M_h._M_buckets);
  }
  ProfilingInfo::DefaultRootSettings();
  p_Var3 = &root_metrics._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    metric_1 = (MetricsType)*(size_type *)(p_Var3 + 1);
    ::std::
    _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::_M_erase(&this_00->_M_h,&metric_1);
  }
  ::std::
  _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&root_metrics._M_h);
  return;
}

Assistant:

OperatorProfiler::OperatorProfiler(ClientContext &context) : context(context) {
	enabled = QueryProfiler::Get(context).IsEnabled();
	auto &context_metrics = ClientConfig::GetConfig(context).profiler_settings;

	// Expand.
	for (const auto metric : context_metrics) {
		settings.insert(metric);
		ProfilingInfo::Expand(settings, metric);
	}

	// Reduce.
	auto root_metrics = ProfilingInfo::DefaultRootSettings();
	for (const auto metric : root_metrics) {
		settings.erase(metric);
	}
}